

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O3

ThreadCachePtr tcmalloc::ThreadCachePtr::GetSlow(void)

{
  undefined1 auVar1 [16];
  ThreadCache *__pointer;
  undefined8 extraout_RDX;
  undefined8 *in_FS_OFFSET;
  ThreadCachePtr TVar2;
  undefined1 local_58 [8];
  Entry registration;
  Result tr;
  
  SlowTLS::Lookup();
  if (tr.ht_place_ == (Entry **)0x0) {
    if (tls_key_ == 0xffffffff) {
      TVar2 = GetReallySlow();
      return TVar2;
    }
    __pointer = ThreadCache::NewHeap();
LAB_00121a2c:
    registration.cache._0_2_ = 0;
    local_58 = (undefined1  [8])__pointer;
    SlowTLS::RegisterEntry((Result *)&registration.prev,(Entry *)local_58);
    pthread_setspecific(tls_key_,__pointer);
    SlowTLS::UnregisterEntry((Entry *)local_58);
    *in_FS_OFFSET = __pointer;
  }
  else {
    if (*(char *)(tr.ht_place_ + 1) != '\0') {
      auVar1._1_7_ = (int7)((ulong)extraout_RDX >> 8);
      auVar1[0] = 1;
      auVar1._8_8_ = 0;
      return (ThreadCachePtr)(auVar1 << 0x40);
    }
    if ((*(char *)((long)tr.ht_place_ + 9) == '\x01') && (tls_key_ != 0xffffffff)) {
      __pointer = (ThreadCache *)*tr.ht_place_;
      SlowTLS::UnregisterEntry((Entry *)tr.ht_place_);
      if (__pointer != (ThreadCache *)0x0) goto LAB_00121a2c;
    }
    __pointer = (ThreadCache *)*tr.ht_place_;
  }
  TVar2._8_8_ = 0;
  TVar2.ptr_ = __pointer;
  return TVar2;
}

Assistant:

ThreadCachePtr ThreadCachePtr::GetSlow() {
  // We're being called after GetIfPresent found no cache in normal
  // TLS storage.
  ASSERT(GetIfPresent() == nullptr);

  SlowTLS::Result tr = SlowTLS::Lookup();

  ThreadCache* cache;

  if (tr.Found()) {
    if (tr.IsEmergencyMalloc()) {
      return {nullptr, true};
    }

    // We found TLS entry with our cache. Lets check if we want try
    // convert this cache from pre-tls-ready mode to proper one.
    cache = SlowTLS::TryToReleaseCacheFromAllocation(&tr);
    if (cache == nullptr) {
      // If not, then we return the cache we got in the entry. This
      // must be thread cache instance being set inside ongoing
      // SetTlsValue.
      return {tr.GetCache(), false};
    }
  } else {
    if (!ThreadCacheKeyIsReady()) {
      return GetReallySlow();
    }
    // We're sure that everything is initialized enough to not just
    // create new ThreadCache instance, but to set it into TLS
    // storage.
    cache = ThreadCache::NewHeap();
  }

  SlowTLS::Entry registration{cache};

  // Register our newly created (or extracted from
  // TryToReleaseCacheFromAllocation) cache instance in slow
  // storage. So that if SetTlsValue below recurses back into malloc,
  // we're able to find it and avoid more SetTlsValue
  // recursion.
  SlowTLS::RegisterEntry(&tr, &registration);

  SetTlsValue(tls_key_, cache);

  SlowTLS::UnregisterEntry(&registration);

  // Note, we could set it before SetTlsValue above and actually
  // prevent any risk of SetTlsValue recursion. But since we want to
  // ensure test coverage for somewhat less common !kHaveGoodTLS
  // systems, lets have "good" systems run the "bad systems'" logic
  // too. For test coverage. Very slight performance hit for of the
  // SlowTLS registration for newly created threads we can afford.
  if constexpr (kHaveGoodTLS) {
    tls_data_.fast_path_cache = cache;
  }

  return {cache, false};
}